

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::InterpolateAtSampleRenderCase::preDraw
          (InterpolateAtSampleRenderCase *this)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  TestError *pTVar5;
  allocator<char> local_1a9;
  MessageBuilder local_1a8;
  long lVar4;
  
  if (this->m_indexMode == INDEXING_DYNAMIC) {
    iVar1 = (this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
            m_numTargetSamples;
    iVar2 = (*((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
               super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    iVar2 = (**(code **)(lVar4 + 0xb48))
                      ((((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                        m_program)->m_program).m_program,"u_offset");
    iVar3 = (**(code **)(lVar4 + 0xb48))
                      ((((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                        m_program)->m_program).m_program,"u_range");
    if (iVar2 == -1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"Location of u_offset was -1",&local_1a9);
      tcu::TestError::TestError(pTVar5,(string *)&local_1a8);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (iVar3 == -1) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"Location of u_range was -1",&local_1a9);
      tcu::TestError::TestError(pTVar5,(string *)&local_1a8);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x14f0))(iVar2,0);
    (**(code **)(lVar4 + 0x14f0))
              (iVar3,(this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.
                     m_numTargetSamples);
    err = (**(code **)(lVar4 + 0x800))();
    glu::checkError(err,"set uniforms",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderMultisampleInterpolationTests.cpp"
                    ,0x1be);
    local_1a8.m_log =
         ((this->super_MultisampleShadeCountRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &local_1a8.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Set u_offset = ");
    std::ostream::operator<<(this_00,1);
    std::operator<<((ostream *)this_00,"\n");
    std::operator<<((ostream *)this_00,"Set u_range = ");
    std::ostream::operator<<(this_00,iVar1);
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return;
}

Assistant:

void InterpolateAtSampleRenderCase::preDraw (void)
{
	if (m_indexMode == INDEXING_DYNAMIC)
	{
		const deInt32			range		= m_numTargetSamples;
		const deInt32			offset		= 1;
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const deInt32			offsetLoc	= gl.getUniformLocation(m_program->getProgram(), "u_offset");
		const deInt32			rangeLoc	= gl.getUniformLocation(m_program->getProgram(), "u_range");

		if (offsetLoc == -1)
			throw tcu::TestError("Location of u_offset was -1");
		if (rangeLoc == -1)
			throw tcu::TestError("Location of u_range was -1");

		gl.uniform1i(offsetLoc, 0);
		gl.uniform1i(rangeLoc, m_numTargetSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set uniforms");

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Set u_offset = " << offset << "\n"
			<< "Set u_range = " << range
			<< tcu::TestLog::EndMessage;
	}
}